

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AppendSpace(StrAccum *pAccum,int N)

{
  for (; 0x1c < N; N = N + -0x1d) {
    sqlite3StrAccumAppend(pAccum,"                             ",0x1d);
  }
  if (0 < N) {
    sqlite3StrAccumAppend(pAccum,"                             ",N);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AppendSpace(StrAccum *pAccum, int N){
  static const char zSpaces[] = "                             ";
  while( N>=(int)sizeof(zSpaces)-1 ){
    sqlite3StrAccumAppend(pAccum, zSpaces, sizeof(zSpaces)-1);
    N -= sizeof(zSpaces)-1;
  }
  if( N>0 ){
    sqlite3StrAccumAppend(pAccum, zSpaces, N);
  }
}